

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct64_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int in_ECX;
  uint uVar6;
  long lVar7;
  int in_EDX;
  undefined8 *in_RDI;
  int in_R8D;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  __m256i tmp4;
  __m256i tmp3;
  __m256i tmp2;
  __m256i tmp1;
  __m256i u [64];
  __m256i cospim61;
  __m256i cospim60;
  __m256i cospim58;
  __m256i cospim57;
  __m256i cospim56;
  __m256i cospim53;
  __m256i cospim52;
  __m256i cospim50;
  __m256i cospim49;
  __m256i cospim48;
  __m256i cospim44;
  __m256i cospim40;
  __m256i cospim36;
  __m256i cospim32;
  __m256i cospim28;
  __m256i cospim24;
  __m256i cospim20;
  __m256i cospim16;
  __m256i cospim12;
  __m256i cospim8;
  __m256i cospim4;
  __m256i cospi63;
  __m256i cospi62;
  __m256i cospi60;
  __m256i cospi59;
  __m256i cospi56;
  __m256i cospi55;
  __m256i cospi54;
  __m256i cospi52;
  __m256i cospi51;
  __m256i cospi48;
  __m256i cospi44;
  __m256i cospi40;
  __m256i cospi36;
  __m256i cospi32;
  __m256i cospi28;
  __m256i cospi24;
  __m256i cospi20;
  __m256i cospi16;
  __m256i cospi15;
  __m256i cospi14;
  __m256i cospi13;
  __m256i cospi12;
  __m256i cospi11;
  __m256i cospi10;
  __m256i cospi9;
  __m256i cospi8;
  __m256i cospi7;
  __m256i cospi6;
  __m256i cospi5;
  __m256i cospi4;
  __m256i cospi3;
  __m256i cospi2;
  __m256i cospi1;
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  int32_t *cospi;
  int j;
  int i;
  __m256i *cospim48_00;
  undefined8 in_stack_ffffffffffffdfb8;
  undefined4 in_stack_ffffffffffffdfc0;
  undefined4 in_stack_ffffffffffffdfc4;
  int in_stack_ffffffffffffdfc8;
  undefined4 in_stack_ffffffffffffdfcc;
  __m256i *in_stack_ffffffffffffdfd0;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint bit_00;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint out_shift_00;
  uint bd_00;
  uint do_cols_00;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  int local_1f48;
  undefined8 local_1ec0 [4];
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined1 local_16c0 [16];
  undefined1 auStack_16b0 [16];
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  longlong local_1000;
  longlong lStack_ff8;
  longlong lStack_ff0;
  longlong lStack_fe8;
  longlong local_fe0;
  longlong lStack_fd8;
  longlong lStack_fd0;
  longlong lStack_fc8;
  int local_fa4;
  undefined1 local_fa0 [16];
  undefined1 auStack_f90 [16];
  int32_t *local_f78;
  int local_f70;
  int local_f6c;
  int local_f64;
  int local_f60;
  int local_f5c;
  undefined8 *local_f50;
  uint local_f44;
  uint local_f40;
  uint local_f3c;
  uint local_f38;
  uint local_f34;
  uint local_f30;
  uint local_f2c;
  uint local_f28;
  uint local_f24;
  uint local_f20;
  uint local_f1c;
  uint local_f18;
  uint local_f14;
  uint local_f10;
  uint local_f0c;
  uint local_f08;
  uint local_f04;
  uint local_f00;
  uint local_efc;
  uint local_ef8;
  uint local_ef4;
  uint local_ef0;
  uint local_eec;
  uint local_ee8;
  uint local_ee4;
  uint local_ee0;
  uint local_edc;
  uint local_ed8;
  uint local_ed4;
  uint local_ed0;
  uint local_ecc;
  uint local_ec8;
  uint local_ec4;
  uint local_ec0;
  uint local_ebc;
  uint local_eb8;
  uint local_eb4;
  uint local_eb0;
  uint local_eac;
  uint local_ea8;
  uint local_ea4;
  uint local_ea0;
  uint local_e9c;
  uint local_e98;
  uint local_e94;
  uint local_e90;
  uint local_e8c;
  uint local_e88;
  uint local_e84;
  uint local_e80;
  uint local_e7c;
  uint local_e78;
  uint local_e74;
  uint local_e70;
  uint local_e6c;
  uint local_e68;
  uint local_e64;
  undefined1 local_e60 [32];
  uint local_e40;
  uint local_e3c;
  uint local_e38;
  uint local_e34;
  uint local_e30;
  uint local_e2c;
  uint local_e28;
  uint local_e24;
  undefined1 local_e20 [16];
  undefined1 auStack_e10 [16];
  uint local_e00;
  uint local_dfc;
  uint local_df8;
  uint local_df4;
  uint local_df0;
  uint local_dec;
  uint local_de8;
  uint local_de4;
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  uint local_dc0;
  uint local_dbc;
  uint local_db8;
  uint local_db4;
  uint local_db0;
  uint local_dac;
  uint local_da8;
  uint local_da4;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  uint local_d80;
  uint local_d7c;
  uint local_d78;
  uint local_d74;
  uint local_d70;
  uint local_d6c;
  uint local_d68;
  uint local_d64;
  undefined1 local_d60 [16];
  undefined1 auStack_d50 [16];
  uint local_d40;
  uint local_d3c;
  uint local_d38;
  uint local_d34;
  uint local_d30;
  uint local_d2c;
  uint local_d28;
  uint local_d24;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  uint local_d00;
  uint local_cfc;
  uint local_cf8;
  uint local_cf4;
  uint local_cf0;
  uint local_cec;
  uint local_ce8;
  uint local_ce4;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  uint local_cc0;
  uint local_cbc;
  uint local_cb8;
  uint local_cb4;
  uint local_cb0;
  uint local_cac;
  uint local_ca8;
  uint local_ca4;
  undefined1 local_ca0 [16];
  undefined1 auStack_c90 [16];
  uint local_c80;
  uint local_c7c;
  uint local_c78;
  uint local_c74;
  uint local_c70;
  uint local_c6c;
  uint local_c68;
  uint local_c64;
  undefined1 local_c60 [16];
  undefined1 auStack_c50 [16];
  uint local_c40;
  uint local_c3c;
  uint local_c38;
  uint local_c34;
  uint local_c30;
  uint local_c2c;
  uint local_c28;
  uint local_c24;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  uint local_c00;
  uint local_bfc;
  uint local_bf8;
  uint local_bf4;
  uint local_bf0;
  uint local_bec;
  uint local_be8;
  uint local_be4;
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  uint local_bc0;
  uint local_bbc;
  uint local_bb8;
  uint local_bb4;
  uint local_bb0;
  uint local_bac;
  uint local_ba8;
  uint local_ba4;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  uint local_b80;
  uint local_b7c;
  uint local_b78;
  uint local_b74;
  uint local_b70;
  uint local_b6c;
  uint local_b68;
  uint local_b64;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  uint local_b40;
  uint local_b3c;
  uint local_b38;
  uint local_b34;
  uint local_b30;
  uint local_b2c;
  uint local_b28;
  uint local_b24;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  uint local_b00;
  uint local_afc;
  uint local_af8;
  uint local_af4;
  uint local_af0;
  uint local_aec;
  uint local_ae8;
  uint local_ae4;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  uint local_ac0;
  uint local_abc;
  uint local_ab8;
  uint local_ab4;
  uint local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  uint local_a74;
  uint local_a70;
  uint local_a6c;
  uint local_a68;
  uint local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a34;
  uint local_a30;
  uint local_a2c;
  uint local_a28;
  uint local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  uint local_a00;
  uint local_9fc;
  uint local_9f8;
  uint local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  uint local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  uint local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  uint local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  uint local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  uint local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  uint local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  uint local_92c;
  uint local_928;
  uint local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  uint local_8ec;
  uint local_8e8;
  uint local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  uint local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  uint local_8ac;
  uint local_8a8;
  uint local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  uint local_880;
  uint local_87c;
  uint local_878;
  uint local_874;
  uint local_870;
  uint local_86c;
  uint local_868;
  uint local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  uint local_840;
  uint local_83c;
  uint local_838;
  uint local_834;
  uint local_830;
  uint local_82c;
  uint local_828;
  uint local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  uint local_800;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  uint local_7f0;
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  uint local_7c0;
  uint local_7bc;
  uint local_7b8;
  uint local_7b4;
  uint local_7b0;
  uint local_7ac;
  uint local_7a8;
  uint local_7a4;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  uint local_780;
  uint local_77c;
  uint local_778;
  uint local_774;
  uint local_770;
  uint local_76c;
  uint local_768;
  uint local_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  uint local_740;
  uint local_73c;
  uint local_738;
  uint local_734;
  uint local_730;
  uint local_72c;
  uint local_728;
  uint local_724;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  uint local_700;
  uint local_6fc;
  uint local_6f8;
  uint local_6f4;
  uint local_6f0;
  uint local_6ec;
  uint local_6e8;
  uint local_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  uint local_6c0;
  uint local_6bc;
  uint local_6b8;
  uint local_6b4;
  uint local_6b0;
  uint local_6ac;
  uint local_6a8;
  uint local_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  uint local_680;
  uint local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  uint local_66c;
  uint local_668;
  uint local_664;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  uint local_640;
  uint local_63c;
  uint local_638;
  uint local_634;
  uint local_630;
  uint local_62c;
  uint local_628;
  uint local_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  uint local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  uint local_5c0;
  uint local_5bc;
  uint local_5b8;
  uint local_5b4;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  uint local_580;
  uint local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  uint local_540;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528;
  uint local_524;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  uint local_500;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  uint local_4a8;
  uint local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  uint local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  uint local_424;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  undefined1 local_60 [32];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  local_f64 = in_R8D;
  local_f60 = in_ECX;
  local_f5c = in_EDX;
  local_f50 = in_RDI;
  local_f78 = cospi_arr(in_EDX);
  local_e64 = 1 << ((char)local_f5c - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_e64),local_e64,1);
  auVar1 = vpinsrd_avx(auVar1,local_e64,2);
  auVar1 = vpinsrd_avx(auVar1,local_e64,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_e64),local_e64,1);
  auVar2 = vpinsrd_avx(auVar2,local_e64,2);
  auVar2 = vpinsrd_avx(auVar2,local_e64,3);
  local_e60._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_e60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  iVar3 = 8;
  if (local_f60 != 0) {
    iVar3 = 6;
  }
  if (local_f64 + iVar3 < 0x10) {
    local_1f48 = 0x10;
  }
  else {
    local_1f48 = 8;
    if (local_f60 != 0) {
      local_1f48 = 6;
    }
    local_1f48 = local_f64 + local_1f48;
  }
  local_fa4 = local_1f48;
  iVar3 = local_fa4;
  local_fa4._0_1_ = (char)local_1f48;
  uVar6 = -(1 << ((char)local_fa4 - 1U & 0x1f));
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  local_e20 = vpinsrd_avx(auVar1,uVar6,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  auStack_e10 = vpinsrd_avx(auVar1,uVar6,3);
  local_fe0 = local_e20._0_8_;
  lStack_fd8 = local_e20._8_8_;
  lStack_fd0 = auStack_e10._0_8_;
  lStack_fc8 = auStack_e10._8_8_;
  uVar4 = (1 << ((char)local_fa4 - 1U & 0x1f)) - 1;
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  local_de0 = vpinsrd_avx(auVar1,uVar4,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  auStack_dd0 = vpinsrd_avx(auVar1,uVar4,3);
  local_1000 = local_de0._0_8_;
  lStack_ff8 = local_de0._8_8_;
  lStack_ff0 = auStack_dd0._0_8_;
  lStack_fe8 = auStack_dd0._8_8_;
  uVar32 = local_f78[1];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  local_da0 = vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  auStack_d90 = vpinsrd_avx(auVar1,uVar32,3);
  local_1020 = local_da0._0_8_;
  uStack_1018 = local_da0._8_8_;
  uStack_1010 = auStack_d90._0_8_;
  uStack_1008 = auStack_d90._8_8_;
  uVar33 = local_f78[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar33),uVar33,1);
  auVar1 = vpinsrd_avx(auVar1,uVar33,2);
  local_d60 = vpinsrd_avx(auVar1,uVar33,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar33),uVar33,1);
  auVar1 = vpinsrd_avx(auVar1,uVar33,2);
  auStack_d50 = vpinsrd_avx(auVar1,uVar33,3);
  local_1040 = local_d60._0_8_;
  uStack_1038 = local_d60._8_8_;
  uStack_1030 = auStack_d50._0_8_;
  uStack_1028 = auStack_d50._8_8_;
  uVar34 = local_f78[3];
  auVar1 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
  auVar1 = vpinsrd_avx(auVar1,uVar34,2);
  local_d20 = vpinsrd_avx(auVar1,uVar34,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
  auVar1 = vpinsrd_avx(auVar1,uVar34,2);
  auStack_d10 = vpinsrd_avx(auVar1,uVar34,3);
  local_1060 = local_d20._0_8_;
  uStack_1058 = local_d20._8_8_;
  uStack_1050 = auStack_d10._0_8_;
  uStack_1048 = auStack_d10._8_8_;
  bit_00 = local_f78[4];
  auVar1 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar1 = vpinsrd_avx(auVar1,bit_00,2);
  local_ce0 = vpinsrd_avx(auVar1,bit_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar1 = vpinsrd_avx(auVar1,bit_00,2);
  auStack_cd0 = vpinsrd_avx(auVar1,bit_00,3);
  local_1080 = local_ce0._0_8_;
  uStack_1078 = local_ce0._8_8_;
  uStack_1070 = auStack_cd0._0_8_;
  uStack_1068 = auStack_cd0._8_8_;
  uVar35 = local_f78[5];
  auVar1 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
  auVar1 = vpinsrd_avx(auVar1,uVar35,2);
  local_ca0 = vpinsrd_avx(auVar1,uVar35,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
  auVar1 = vpinsrd_avx(auVar1,uVar35,2);
  auStack_c90 = vpinsrd_avx(auVar1,uVar35,3);
  local_10a0 = local_ca0._0_8_;
  uStack_1098 = local_ca0._8_8_;
  uStack_1090 = auStack_c90._0_8_;
  uStack_1088 = auStack_c90._8_8_;
  uVar36 = local_f78[6];
  auVar1 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar1 = vpinsrd_avx(auVar1,uVar36,2);
  local_c60 = vpinsrd_avx(auVar1,uVar36,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar1 = vpinsrd_avx(auVar1,uVar36,2);
  auStack_c50 = vpinsrd_avx(auVar1,uVar36,3);
  local_10c0 = local_c60._0_8_;
  uStack_10b8 = local_c60._8_8_;
  uStack_10b0 = auStack_c50._0_8_;
  uStack_10a8 = auStack_c50._8_8_;
  uVar37 = local_f78[7];
  auVar1 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar1 = vpinsrd_avx(auVar1,uVar37,2);
  local_c20 = vpinsrd_avx(auVar1,uVar37,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar1 = vpinsrd_avx(auVar1,uVar37,2);
  auStack_c10 = vpinsrd_avx(auVar1,uVar37,3);
  local_10e0 = local_c20._0_8_;
  uStack_10d8 = local_c20._8_8_;
  uStack_10d0 = auStack_c10._0_8_;
  uStack_10c8 = auStack_c10._8_8_;
  uVar38 = local_f78[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar1 = vpinsrd_avx(auVar1,uVar38,2);
  local_be0 = vpinsrd_avx(auVar1,uVar38,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar1 = vpinsrd_avx(auVar1,uVar38,2);
  auStack_bd0 = vpinsrd_avx(auVar1,uVar38,3);
  local_1100 = local_be0._0_8_;
  uStack_10f8 = local_be0._8_8_;
  uStack_10f0 = auStack_bd0._0_8_;
  uStack_10e8 = auStack_bd0._8_8_;
  uVar39 = local_f78[9];
  auVar1 = vpinsrd_avx(ZEXT416(uVar39),uVar39,1);
  auVar1 = vpinsrd_avx(auVar1,uVar39,2);
  local_ba0 = vpinsrd_avx(auVar1,uVar39,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar39),uVar39,1);
  auVar1 = vpinsrd_avx(auVar1,uVar39,2);
  auStack_b90 = vpinsrd_avx(auVar1,uVar39,3);
  local_1120 = local_ba0._0_8_;
  uStack_1118 = local_ba0._8_8_;
  uStack_1110 = auStack_b90._0_8_;
  uStack_1108 = auStack_b90._8_8_;
  uVar40 = local_f78[10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar1 = vpinsrd_avx(auVar1,uVar40,2);
  local_b60 = vpinsrd_avx(auVar1,uVar40,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar40),uVar40,1);
  auVar1 = vpinsrd_avx(auVar1,uVar40,2);
  auStack_b50 = vpinsrd_avx(auVar1,uVar40,3);
  local_1140 = local_b60._0_8_;
  uStack_1138 = local_b60._8_8_;
  uStack_1130 = auStack_b50._0_8_;
  uStack_1128 = auStack_b50._8_8_;
  uVar41 = local_f78[0xb];
  auVar1 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar1 = vpinsrd_avx(auVar1,uVar41,2);
  local_b20 = vpinsrd_avx(auVar1,uVar41,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar1 = vpinsrd_avx(auVar1,uVar41,2);
  auStack_b10 = vpinsrd_avx(auVar1,uVar41,3);
  local_1160 = local_b20._0_8_;
  uStack_1158 = local_b20._8_8_;
  uStack_1150 = auStack_b10._0_8_;
  uStack_1148 = auStack_b10._8_8_;
  uVar42 = local_f78[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar42),uVar42,1);
  auVar1 = vpinsrd_avx(auVar1,uVar42,2);
  local_ae0 = vpinsrd_avx(auVar1,uVar42,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar42),uVar42,1);
  auVar1 = vpinsrd_avx(auVar1,uVar42,2);
  auStack_ad0 = vpinsrd_avx(auVar1,uVar42,3);
  local_1180 = local_ae0._0_8_;
  uStack_1178 = local_ae0._8_8_;
  uStack_1170 = auStack_ad0._0_8_;
  uStack_1168 = auStack_ad0._8_8_;
  uVar43 = local_f78[0xd];
  auVar1 = vpinsrd_avx(ZEXT416(uVar43),uVar43,1);
  auVar1 = vpinsrd_avx(auVar1,uVar43,2);
  local_aa0 = vpinsrd_avx(auVar1,uVar43,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar43),uVar43,1);
  auVar1 = vpinsrd_avx(auVar1,uVar43,2);
  auStack_a90 = vpinsrd_avx(auVar1,uVar43,3);
  local_11a0 = local_aa0._0_8_;
  uStack_1198 = local_aa0._8_8_;
  uStack_1190 = auStack_a90._0_8_;
  uStack_1188 = auStack_a90._8_8_;
  out_shift_00 = local_f78[0xe];
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  local_a60 = vpinsrd_avx(auVar1,out_shift_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  auStack_a50 = vpinsrd_avx(auVar1,out_shift_00,3);
  local_11c0 = local_a60._0_8_;
  uStack_11b8 = local_a60._8_8_;
  uStack_11b0 = auStack_a50._0_8_;
  uStack_11a8 = auStack_a50._8_8_;
  bd_00 = local_f78[0xf];
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  local_a20 = vpinsrd_avx(auVar1,bd_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  auStack_a10 = vpinsrd_avx(auVar1,bd_00,3);
  local_11e0 = local_a20._0_8_;
  uStack_11d8 = local_a20._8_8_;
  uStack_11d0 = auStack_a10._0_8_;
  uStack_11c8 = auStack_a10._8_8_;
  do_cols_00 = local_f78[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  local_9e0 = vpinsrd_avx(auVar1,do_cols_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  auStack_9d0 = vpinsrd_avx(auVar1,do_cols_00,3);
  local_1200 = local_9e0._0_8_;
  uStack_11f8 = local_9e0._8_8_;
  uStack_11f0 = auStack_9d0._0_8_;
  uStack_11e8 = auStack_9d0._8_8_;
  uVar44 = local_f78[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar44),uVar44,1);
  auVar1 = vpinsrd_avx(auVar1,uVar44,2);
  local_9a0 = vpinsrd_avx(auVar1,uVar44,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar44),uVar44,1);
  auVar1 = vpinsrd_avx(auVar1,uVar44,2);
  auStack_990 = vpinsrd_avx(auVar1,uVar44,3);
  local_1220 = local_9a0._0_8_;
  uStack_1218 = local_9a0._8_8_;
  uStack_1210 = auStack_990._0_8_;
  uStack_1208 = auStack_990._8_8_;
  uVar45 = local_f78[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar1 = vpinsrd_avx(auVar1,uVar45,2);
  local_960 = vpinsrd_avx(auVar1,uVar45,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar1 = vpinsrd_avx(auVar1,uVar45,2);
  auStack_950 = vpinsrd_avx(auVar1,uVar45,3);
  local_1240 = local_960._0_8_;
  uStack_1238 = local_960._8_8_;
  uStack_1230 = auStack_950._0_8_;
  uStack_1228 = auStack_950._8_8_;
  uVar46 = local_f78[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar46),uVar46,1);
  auVar1 = vpinsrd_avx(auVar1,uVar46,2);
  local_920 = vpinsrd_avx(auVar1,uVar46,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar46),uVar46,1);
  auVar1 = vpinsrd_avx(auVar1,uVar46,2);
  auStack_910 = vpinsrd_avx(auVar1,uVar46,3);
  local_1260 = local_920._0_8_;
  uStack_1258 = local_920._8_8_;
  uStack_1250 = auStack_910._0_8_;
  uStack_1248 = auStack_910._8_8_;
  uVar47 = local_f78[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar47),uVar47,1);
  auVar1 = vpinsrd_avx(auVar1,uVar47,2);
  local_8e0 = vpinsrd_avx(auVar1,uVar47,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar47),uVar47,1);
  auVar1 = vpinsrd_avx(auVar1,uVar47,2);
  auStack_8d0 = vpinsrd_avx(auVar1,uVar47,3);
  local_1280 = local_8e0._0_8_;
  uStack_1278 = local_8e0._8_8_;
  uStack_1270 = auStack_8d0._0_8_;
  uStack_1268 = auStack_8d0._8_8_;
  uVar48 = local_f78[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(uVar48),uVar48,1);
  auVar1 = vpinsrd_avx(auVar1,uVar48,2);
  local_8a0 = vpinsrd_avx(auVar1,uVar48,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar48),uVar48,1);
  auVar1 = vpinsrd_avx(auVar1,uVar48,2);
  auStack_890 = vpinsrd_avx(auVar1,uVar48,3);
  local_12a0 = local_8a0._0_8_;
  uStack_1298 = local_8a0._8_8_;
  uStack_1290 = auStack_890._0_8_;
  uStack_1288 = auStack_890._8_8_;
  uVar49 = local_f78[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar1 = vpinsrd_avx(auVar1,uVar49,2);
  local_860 = vpinsrd_avx(auVar1,uVar49,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar1 = vpinsrd_avx(auVar1,uVar49,2);
  auStack_850 = vpinsrd_avx(auVar1,uVar49,3);
  local_12c0 = local_860._0_8_;
  uStack_12b8 = local_860._8_8_;
  uStack_12b0 = auStack_850._0_8_;
  uStack_12a8 = auStack_850._8_8_;
  uVar50 = local_f78[0x2c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar1 = vpinsrd_avx(auVar1,uVar50,2);
  local_820 = vpinsrd_avx(auVar1,uVar50,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar1 = vpinsrd_avx(auVar1,uVar50,2);
  auStack_810 = vpinsrd_avx(auVar1,uVar50,3);
  local_12e0 = local_820._0_8_;
  uStack_12d8 = local_820._8_8_;
  uStack_12d0 = auStack_810._0_8_;
  uStack_12c8 = auStack_810._8_8_;
  uVar51 = local_f78[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar1 = vpinsrd_avx(auVar1,uVar51,2);
  local_7e0 = vpinsrd_avx(auVar1,uVar51,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar1 = vpinsrd_avx(auVar1,uVar51,2);
  auStack_7d0 = vpinsrd_avx(auVar1,uVar51,3);
  local_1300 = local_7e0._0_8_;
  uStack_12f8 = local_7e0._8_8_;
  uStack_12f0 = auStack_7d0._0_8_;
  uStack_12e8 = auStack_7d0._8_8_;
  uVar52 = local_f78[0x33];
  auVar1 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar1 = vpinsrd_avx(auVar1,uVar52,2);
  local_7a0 = vpinsrd_avx(auVar1,uVar52,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar1 = vpinsrd_avx(auVar1,uVar52,2);
  auStack_790 = vpinsrd_avx(auVar1,uVar52,3);
  local_1320 = local_7a0._0_8_;
  uStack_1318 = local_7a0._8_8_;
  uStack_1310 = auStack_790._0_8_;
  uStack_1308 = auStack_790._8_8_;
  uVar53 = local_f78[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar53),uVar53,1);
  auVar1 = vpinsrd_avx(auVar1,uVar53,2);
  local_760 = vpinsrd_avx(auVar1,uVar53,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar53),uVar53,1);
  auVar1 = vpinsrd_avx(auVar1,uVar53,2);
  auStack_750 = vpinsrd_avx(auVar1,uVar53,3);
  local_1340 = local_760._0_8_;
  uStack_1338 = local_760._8_8_;
  uStack_1330 = auStack_750._0_8_;
  uStack_1328 = auStack_750._8_8_;
  uVar54 = local_f78[0x36];
  auVar1 = vpinsrd_avx(ZEXT416(uVar54),uVar54,1);
  auVar1 = vpinsrd_avx(auVar1,uVar54,2);
  local_720 = vpinsrd_avx(auVar1,uVar54,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar54),uVar54,1);
  auVar1 = vpinsrd_avx(auVar1,uVar54,2);
  auStack_710 = vpinsrd_avx(auVar1,uVar54,3);
  local_1360 = local_720._0_8_;
  uStack_1358 = local_720._8_8_;
  uStack_1350 = auStack_710._0_8_;
  uStack_1348 = auStack_710._8_8_;
  uVar55 = local_f78[0x37];
  auVar1 = vpinsrd_avx(ZEXT416(uVar55),uVar55,1);
  auVar1 = vpinsrd_avx(auVar1,uVar55,2);
  local_6e0 = vpinsrd_avx(auVar1,uVar55,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar55),uVar55,1);
  auVar1 = vpinsrd_avx(auVar1,uVar55,2);
  auStack_6d0 = vpinsrd_avx(auVar1,uVar55,3);
  local_1380 = local_6e0._0_8_;
  uStack_1378 = local_6e0._8_8_;
  uStack_1370 = auStack_6d0._0_8_;
  uStack_1368 = auStack_6d0._8_8_;
  uVar56 = local_f78[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar1 = vpinsrd_avx(auVar1,uVar56,2);
  local_6a0 = vpinsrd_avx(auVar1,uVar56,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar1 = vpinsrd_avx(auVar1,uVar56,2);
  auStack_690 = vpinsrd_avx(auVar1,uVar56,3);
  local_13a0 = local_6a0._0_8_;
  uStack_1398 = local_6a0._8_8_;
  uStack_1390 = auStack_690._0_8_;
  uStack_1388 = auStack_690._8_8_;
  uVar57 = local_f78[0x3b];
  auVar1 = vpinsrd_avx(ZEXT416(uVar57),uVar57,1);
  auVar1 = vpinsrd_avx(auVar1,uVar57,2);
  local_660 = vpinsrd_avx(auVar1,uVar57,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar57),uVar57,1);
  auVar1 = vpinsrd_avx(auVar1,uVar57,2);
  auStack_650 = vpinsrd_avx(auVar1,uVar57,3);
  local_13c0 = local_660._0_8_;
  uStack_13b8 = local_660._8_8_;
  uStack_13b0 = auStack_650._0_8_;
  uStack_13a8 = auStack_650._8_8_;
  uVar58 = local_f78[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar1 = vpinsrd_avx(auVar1,uVar58,2);
  local_620 = vpinsrd_avx(auVar1,uVar58,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar1 = vpinsrd_avx(auVar1,uVar58,2);
  auStack_610 = vpinsrd_avx(auVar1,uVar58,3);
  local_13e0 = local_620._0_8_;
  uStack_13d8 = local_620._8_8_;
  uStack_13d0 = auStack_610._0_8_;
  uStack_13c8 = auStack_610._8_8_;
  uVar59 = local_f78[0x3e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar59),uVar59,1);
  auVar1 = vpinsrd_avx(auVar1,uVar59,2);
  local_5e0 = vpinsrd_avx(auVar1,uVar59,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar59),uVar59,1);
  auVar1 = vpinsrd_avx(auVar1,uVar59,2);
  auStack_5d0 = vpinsrd_avx(auVar1,uVar59,3);
  local_1400 = local_5e0._0_8_;
  uStack_13f8 = local_5e0._8_8_;
  uStack_13f0 = auStack_5d0._0_8_;
  uStack_13e8 = auStack_5d0._8_8_;
  uVar60 = local_f78[0x3f];
  auVar1 = vpinsrd_avx(ZEXT416(uVar60),uVar60,1);
  auVar1 = vpinsrd_avx(auVar1,uVar60,2);
  local_5a0 = vpinsrd_avx(auVar1,uVar60,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar60),uVar60,1);
  auVar1 = vpinsrd_avx(auVar1,uVar60,2);
  auStack_590 = vpinsrd_avx(auVar1,uVar60,3);
  local_1420 = local_5a0._0_8_;
  uStack_1418 = local_5a0._8_8_;
  uStack_1410 = auStack_590._0_8_;
  uStack_1408 = auStack_590._8_8_;
  uVar5 = -local_f78[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  local_560 = vpinsrd_avx(auVar1,uVar5,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  auStack_550 = vpinsrd_avx(auVar1,uVar5,3);
  local_1440 = local_560._0_8_;
  uStack_1438 = local_560._8_8_;
  uStack_1430 = auStack_550._0_8_;
  uStack_1428 = auStack_550._8_8_;
  local_ef8 = -local_f78[8];
  auVar1 = vpinsrd_avx(ZEXT416(local_ef8),local_ef8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ef8,2);
  local_520 = vpinsrd_avx(auVar1,local_ef8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ef8),local_ef8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ef8,2);
  auStack_510 = vpinsrd_avx(auVar1,local_ef8,3);
  local_1460 = local_520._0_8_;
  uStack_1458 = local_520._8_8_;
  uStack_1450 = auStack_510._0_8_;
  uStack_1448 = auStack_510._8_8_;
  local_efc = -local_f78[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(local_efc),local_efc,1);
  auVar1 = vpinsrd_avx(auVar1,local_efc,2);
  local_4e0 = vpinsrd_avx(auVar1,local_efc,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_efc),local_efc,1);
  auVar1 = vpinsrd_avx(auVar1,local_efc,2);
  auStack_4d0 = vpinsrd_avx(auVar1,local_efc,3);
  local_1480 = local_4e0._0_8_;
  uStack_1478 = local_4e0._8_8_;
  uStack_1470 = auStack_4d0._0_8_;
  uStack_1468 = auStack_4d0._8_8_;
  local_f00 = -local_f78[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_f00),local_f00,1);
  auVar1 = vpinsrd_avx(auVar1,local_f00,2);
  local_4a0 = vpinsrd_avx(auVar1,local_f00,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f00),local_f00,1);
  auVar1 = vpinsrd_avx(auVar1,local_f00,2);
  auStack_490 = vpinsrd_avx(auVar1,local_f00,3);
  local_14a0 = local_4a0._0_8_;
  uStack_1498 = local_4a0._8_8_;
  uStack_1490 = auStack_490._0_8_;
  uStack_1488 = auStack_490._8_8_;
  local_f04 = -local_f78[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(local_f04),local_f04,1);
  auVar1 = vpinsrd_avx(auVar1,local_f04,2);
  local_460 = vpinsrd_avx(auVar1,local_f04,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f04),local_f04,1);
  auVar1 = vpinsrd_avx(auVar1,local_f04,2);
  auStack_450 = vpinsrd_avx(auVar1,local_f04,3);
  local_14c0 = local_460._0_8_;
  uStack_14b8 = local_460._8_8_;
  uStack_14b0 = auStack_450._0_8_;
  uStack_14a8 = auStack_450._8_8_;
  local_f08 = -local_f78[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(local_f08),local_f08,1);
  auVar1 = vpinsrd_avx(auVar1,local_f08,2);
  local_420 = vpinsrd_avx(auVar1,local_f08,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f08),local_f08,1);
  auVar1 = vpinsrd_avx(auVar1,local_f08,2);
  auStack_410 = vpinsrd_avx(auVar1,local_f08,3);
  local_14e0 = local_420._0_8_;
  uStack_14d8 = local_420._8_8_;
  uStack_14d0 = auStack_410._0_8_;
  uStack_14c8 = auStack_410._8_8_;
  local_f0c = -local_f78[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(local_f0c),local_f0c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f0c,2);
  local_3e0 = vpinsrd_avx(auVar1,local_f0c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f0c),local_f0c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f0c,2);
  auStack_3d0 = vpinsrd_avx(auVar1,local_f0c,3);
  local_1500 = local_3e0._0_8_;
  uStack_14f8 = local_3e0._8_8_;
  uStack_14f0 = auStack_3d0._0_8_;
  uStack_14e8 = auStack_3d0._8_8_;
  local_f10 = -local_f78[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(local_f10),local_f10,1);
  auVar1 = vpinsrd_avx(auVar1,local_f10,2);
  local_3a0 = vpinsrd_avx(auVar1,local_f10,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f10),local_f10,1);
  auVar1 = vpinsrd_avx(auVar1,local_f10,2);
  auStack_390 = vpinsrd_avx(auVar1,local_f10,3);
  local_1520 = local_3a0._0_8_;
  uStack_1518 = local_3a0._8_8_;
  uStack_1510 = auStack_390._0_8_;
  uStack_1508 = auStack_390._8_8_;
  local_f14 = -local_f78[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(local_f14),local_f14,1);
  auVar1 = vpinsrd_avx(auVar1,local_f14,2);
  local_360 = vpinsrd_avx(auVar1,local_f14,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f14),local_f14,1);
  auVar1 = vpinsrd_avx(auVar1,local_f14,2);
  auStack_350 = vpinsrd_avx(auVar1,local_f14,3);
  local_1540 = local_360._0_8_;
  uStack_1538 = local_360._8_8_;
  uStack_1530 = auStack_350._0_8_;
  uStack_1528 = auStack_350._8_8_;
  local_f18 = -local_f78[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(local_f18),local_f18,1);
  auVar1 = vpinsrd_avx(auVar1,local_f18,2);
  local_320 = vpinsrd_avx(auVar1,local_f18,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f18),local_f18,1);
  auVar1 = vpinsrd_avx(auVar1,local_f18,2);
  auStack_310 = vpinsrd_avx(auVar1,local_f18,3);
  local_1560 = local_320._0_8_;
  uStack_1558 = local_320._8_8_;
  uStack_1550 = auStack_310._0_8_;
  uStack_1548 = auStack_310._8_8_;
  local_f1c = -local_f78[0x2c];
  auVar1 = vpinsrd_avx(ZEXT416(local_f1c),local_f1c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f1c,2);
  local_2e0 = vpinsrd_avx(auVar1,local_f1c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f1c),local_f1c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f1c,2);
  auStack_2d0 = vpinsrd_avx(auVar1,local_f1c,3);
  local_1580 = local_2e0._0_8_;
  uStack_1578 = local_2e0._8_8_;
  uStack_1570 = auStack_2d0._0_8_;
  uStack_1568 = auStack_2d0._8_8_;
  local_f20 = -local_f78[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(local_f20),local_f20,1);
  auVar1 = vpinsrd_avx(auVar1,local_f20,2);
  local_2a0 = vpinsrd_avx(auVar1,local_f20,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f20),local_f20,1);
  auVar1 = vpinsrd_avx(auVar1,local_f20,2);
  auStack_290 = vpinsrd_avx(auVar1,local_f20,3);
  local_15a0 = local_2a0._0_8_;
  uStack_1598 = local_2a0._8_8_;
  uStack_1590 = auStack_290._0_8_;
  uStack_1588 = auStack_290._8_8_;
  local_f24 = -local_f78[0x31];
  auVar1 = vpinsrd_avx(ZEXT416(local_f24),local_f24,1);
  auVar1 = vpinsrd_avx(auVar1,local_f24,2);
  local_260 = vpinsrd_avx(auVar1,local_f24,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f24),local_f24,1);
  auVar1 = vpinsrd_avx(auVar1,local_f24,2);
  auStack_250 = vpinsrd_avx(auVar1,local_f24,3);
  local_15c0 = local_260._0_8_;
  uStack_15b8 = local_260._8_8_;
  uStack_15b0 = auStack_250._0_8_;
  uStack_15a8 = auStack_250._8_8_;
  local_f28 = -local_f78[0x32];
  auVar1 = vpinsrd_avx(ZEXT416(local_f28),local_f28,1);
  auVar1 = vpinsrd_avx(auVar1,local_f28,2);
  local_220 = vpinsrd_avx(auVar1,local_f28,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f28),local_f28,1);
  auVar1 = vpinsrd_avx(auVar1,local_f28,2);
  auStack_210 = vpinsrd_avx(auVar1,local_f28,3);
  local_15e0 = local_220._0_8_;
  uStack_15d8 = local_220._8_8_;
  uStack_15d0 = auStack_210._0_8_;
  uStack_15c8 = auStack_210._8_8_;
  local_f2c = -local_f78[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(local_f2c),local_f2c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f2c,2);
  local_1e0 = vpinsrd_avx(auVar1,local_f2c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f2c),local_f2c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f2c,2);
  auStack_1d0 = vpinsrd_avx(auVar1,local_f2c,3);
  local_1600 = local_1e0._0_8_;
  uStack_15f8 = local_1e0._8_8_;
  uStack_15f0 = auStack_1d0._0_8_;
  uStack_15e8 = auStack_1d0._8_8_;
  local_f30 = -local_f78[0x35];
  auVar1 = vpinsrd_avx(ZEXT416(local_f30),local_f30,1);
  auVar1 = vpinsrd_avx(auVar1,local_f30,2);
  local_1a0 = vpinsrd_avx(auVar1,local_f30,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f30),local_f30,1);
  auVar1 = vpinsrd_avx(auVar1,local_f30,2);
  auStack_190 = vpinsrd_avx(auVar1,local_f30,3);
  local_1620 = local_1a0._0_8_;
  uStack_1618 = local_1a0._8_8_;
  uStack_1610 = auStack_190._0_8_;
  uStack_1608 = auStack_190._8_8_;
  local_f34 = -local_f78[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(local_f34),local_f34,1);
  auVar1 = vpinsrd_avx(auVar1,local_f34,2);
  local_160 = vpinsrd_avx(auVar1,local_f34,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f34),local_f34,1);
  auVar1 = vpinsrd_avx(auVar1,local_f34,2);
  auStack_150 = vpinsrd_avx(auVar1,local_f34,3);
  local_1640 = local_160._0_8_;
  uStack_1638 = local_160._8_8_;
  uStack_1630 = auStack_150._0_8_;
  uStack_1628 = auStack_150._8_8_;
  local_f38 = -local_f78[0x39];
  auVar1 = vpinsrd_avx(ZEXT416(local_f38),local_f38,1);
  auVar1 = vpinsrd_avx(auVar1,local_f38,2);
  local_120 = vpinsrd_avx(auVar1,local_f38,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f38),local_f38,1);
  auVar1 = vpinsrd_avx(auVar1,local_f38,2);
  auStack_110 = vpinsrd_avx(auVar1,local_f38,3);
  local_1660 = local_120._0_8_;
  uStack_1658 = local_120._8_8_;
  uStack_1650 = auStack_110._0_8_;
  uStack_1648 = auStack_110._8_8_;
  local_f3c = -local_f78[0x3a];
  auVar1 = vpinsrd_avx(ZEXT416(local_f3c),local_f3c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f3c,2);
  local_e0 = vpinsrd_avx(auVar1,local_f3c,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f3c),local_f3c,1);
  auVar1 = vpinsrd_avx(auVar1,local_f3c,2);
  auStack_d0 = vpinsrd_avx(auVar1,local_f3c,3);
  local_1680 = local_e0._0_8_;
  uStack_1678 = local_e0._8_8_;
  uStack_1670 = auStack_d0._0_8_;
  uStack_1668 = auStack_d0._8_8_;
  local_f40 = -local_f78[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(local_f40),local_f40,1);
  auVar1 = vpinsrd_avx(auVar1,local_f40,2);
  local_a0 = vpinsrd_avx(auVar1,local_f40,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_f40),local_f40,1);
  auVar1 = vpinsrd_avx(auVar1,local_f40,2);
  auStack_90 = vpinsrd_avx(auVar1,local_f40,3);
  local_16a0 = local_a0._0_8_;
  uStack_1698 = local_a0._8_8_;
  uStack_1690 = auStack_90._0_8_;
  uStack_1688 = auStack_90._8_8_;
  local_f44 = -local_f78[0x3d];
  auVar1 = vpinsrd_avx(ZEXT416(local_f44),local_f44,1);
  auVar1 = vpinsrd_avx(auVar1,local_f44,2);
  auVar1 = vpinsrd_avx(auVar1,local_f44,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_f44),local_f44,1);
  auVar2 = vpinsrd_avx(auVar2,local_f44,2);
  auVar2 = vpinsrd_avx(auVar2,local_f44,3);
  local_60._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_1ec0[0] = *local_f50;
  local_1ec0[1] = local_f50[1];
  local_1ec0[2] = local_f50[2];
  local_1ec0[3] = local_f50[3];
  local_1ac0 = local_f50[4];
  uStack_1ab8 = local_f50[5];
  uStack_1ab0 = local_f50[6];
  uStack_1aa8 = local_f50[7];
  local_1a40 = local_f50[0x24];
  uStack_1a38 = local_f50[0x25];
  uStack_1a30 = local_f50[0x26];
  uStack_1a28 = local_f50[0x27];
  local_19c0 = local_f50[0x14];
  uStack_19b8 = local_f50[0x15];
  uStack_19b0 = local_f50[0x16];
  uStack_19a8 = local_f50[0x17];
  local_1940 = local_f50[0x34];
  uStack_1938 = local_f50[0x35];
  uStack_1930 = local_f50[0x36];
  uStack_1928 = local_f50[0x37];
  local_18c0 = local_f50[0xc];
  uStack_18b8 = local_f50[0xd];
  uStack_18b0 = local_f50[0xe];
  uStack_18a8 = local_f50[0xf];
  local_1840 = local_f50[0x2c];
  uStack_1838 = local_f50[0x2d];
  uStack_1830 = local_f50[0x2e];
  uStack_1828 = local_f50[0x2f];
  local_17c0 = local_f50[0x1c];
  uStack_17b8 = local_f50[0x1d];
  uStack_17b0 = local_f50[0x1e];
  uStack_17a8 = local_f50[0x1f];
  local_1740 = local_f50[0x3c];
  uStack_1738 = local_f50[0x3d];
  uStack_1730 = local_f50[0x3e];
  uStack_1728 = local_f50[0x3f];
  local_1cc0 = local_f50[8];
  uStack_1cb8 = local_f50[9];
  uStack_1cb0 = local_f50[10];
  uStack_1ca8 = local_f50[0xb];
  local_1c40 = local_f50[0x28];
  uStack_1c38 = local_f50[0x29];
  uStack_1c30 = local_f50[0x2a];
  uStack_1c28 = local_f50[0x2b];
  local_1bc0 = local_f50[0x18];
  uStack_1bb8 = local_f50[0x19];
  uStack_1bb0 = local_f50[0x1a];
  uStack_1ba8 = local_f50[0x1b];
  local_1b40 = local_f50[0x38];
  uStack_1b38 = local_f50[0x39];
  uStack_1b30 = local_f50[0x3a];
  uStack_1b28 = local_f50[0x3b];
  local_1e40 = local_f50[0x20];
  uStack_1e38 = local_f50[0x21];
  uStack_1e30 = local_f50[0x22];
  uStack_1e28 = local_f50[0x23];
  local_1dc0 = local_f50[0x10];
  uStack_1db8 = local_f50[0x11];
  uStack_1db0 = local_f50[0x12];
  uStack_1da8 = local_f50[0x13];
  uVar8 = local_f50[0x30];
  uVar14 = local_f50[0x31];
  uVar20 = local_f50[0x32];
  uVar26 = local_f50[0x33];
  local_1d40 = uVar8;
  uStack_1d38 = uVar14;
  uStack_1d30 = uVar20;
  uStack_1d28 = uVar26;
  local_fa4 = iVar3;
  local_ef4 = uVar5;
  local_ef0 = uVar60;
  local_eec = uVar59;
  local_ee8 = uVar58;
  local_ee4 = uVar57;
  local_ee0 = uVar56;
  local_edc = uVar55;
  local_ed8 = uVar54;
  local_ed4 = uVar53;
  local_ed0 = uVar52;
  local_ecc = uVar51;
  local_ec8 = uVar50;
  local_ec4 = uVar49;
  local_ec0 = uVar48;
  local_ebc = uVar47;
  local_eb8 = uVar46;
  local_eb4 = uVar45;
  local_eb0 = uVar44;
  local_eac = do_cols_00;
  local_ea8 = bd_00;
  local_ea4 = out_shift_00;
  local_ea0 = uVar43;
  local_e9c = uVar42;
  local_e98 = uVar41;
  local_e94 = uVar40;
  local_e90 = uVar39;
  local_e8c = uVar38;
  local_e88 = uVar37;
  local_e84 = uVar36;
  local_e80 = uVar35;
  local_e7c = bit_00;
  local_e78 = uVar34;
  local_e74 = uVar33;
  local_e70 = uVar32;
  local_e6c = uVar4;
  local_e68 = uVar6;
  local_e40 = local_e64;
  local_e3c = local_e64;
  local_e38 = local_e64;
  local_e34 = local_e64;
  local_e30 = local_e64;
  local_e2c = local_e64;
  local_e28 = local_e64;
  local_e24 = local_e64;
  local_e00 = uVar6;
  local_dfc = uVar6;
  local_df8 = uVar6;
  local_df4 = uVar6;
  local_df0 = uVar6;
  local_dec = uVar6;
  local_de8 = uVar6;
  local_de4 = uVar6;
  local_dc0 = uVar4;
  local_dbc = uVar4;
  local_db8 = uVar4;
  local_db4 = uVar4;
  local_db0 = uVar4;
  local_dac = uVar4;
  local_da8 = uVar4;
  local_da4 = uVar4;
  local_d80 = uVar32;
  local_d7c = uVar32;
  local_d78 = uVar32;
  local_d74 = uVar32;
  local_d70 = uVar32;
  local_d6c = uVar32;
  local_d68 = uVar32;
  local_d64 = uVar32;
  local_d40 = uVar33;
  local_d3c = uVar33;
  local_d38 = uVar33;
  local_d34 = uVar33;
  local_d30 = uVar33;
  local_d2c = uVar33;
  local_d28 = uVar33;
  local_d24 = uVar33;
  local_d00 = uVar34;
  local_cfc = uVar34;
  local_cf8 = uVar34;
  local_cf4 = uVar34;
  local_cf0 = uVar34;
  local_cec = uVar34;
  local_ce8 = uVar34;
  local_ce4 = uVar34;
  local_cc0 = bit_00;
  local_cbc = bit_00;
  local_cb8 = bit_00;
  local_cb4 = bit_00;
  local_cb0 = bit_00;
  local_cac = bit_00;
  local_ca8 = bit_00;
  local_ca4 = bit_00;
  local_c80 = uVar35;
  local_c7c = uVar35;
  local_c78 = uVar35;
  local_c74 = uVar35;
  local_c70 = uVar35;
  local_c6c = uVar35;
  local_c68 = uVar35;
  local_c64 = uVar35;
  local_c40 = uVar36;
  local_c3c = uVar36;
  local_c38 = uVar36;
  local_c34 = uVar36;
  local_c30 = uVar36;
  local_c2c = uVar36;
  local_c28 = uVar36;
  local_c24 = uVar36;
  local_c00 = uVar37;
  local_bfc = uVar37;
  local_bf8 = uVar37;
  local_bf4 = uVar37;
  local_bf0 = uVar37;
  local_bec = uVar37;
  local_be8 = uVar37;
  local_be4 = uVar37;
  local_bc0 = uVar38;
  local_bbc = uVar38;
  local_bb8 = uVar38;
  local_bb4 = uVar38;
  local_bb0 = uVar38;
  local_bac = uVar38;
  local_ba8 = uVar38;
  local_ba4 = uVar38;
  local_b80 = uVar39;
  local_b7c = uVar39;
  local_b78 = uVar39;
  local_b74 = uVar39;
  local_b70 = uVar39;
  local_b6c = uVar39;
  local_b68 = uVar39;
  local_b64 = uVar39;
  local_b40 = uVar40;
  local_b3c = uVar40;
  local_b38 = uVar40;
  local_b34 = uVar40;
  local_b30 = uVar40;
  local_b2c = uVar40;
  local_b28 = uVar40;
  local_b24 = uVar40;
  local_b00 = uVar41;
  local_afc = uVar41;
  local_af8 = uVar41;
  local_af4 = uVar41;
  local_af0 = uVar41;
  local_aec = uVar41;
  local_ae8 = uVar41;
  local_ae4 = uVar41;
  local_ac0 = uVar42;
  local_abc = uVar42;
  local_ab8 = uVar42;
  local_ab4 = uVar42;
  local_ab0 = uVar42;
  local_aac = uVar42;
  local_aa8 = uVar42;
  local_aa4 = uVar42;
  local_a80 = uVar43;
  local_a7c = uVar43;
  local_a78 = uVar43;
  local_a74 = uVar43;
  local_a70 = uVar43;
  local_a6c = uVar43;
  local_a68 = uVar43;
  local_a64 = uVar43;
  local_a40 = out_shift_00;
  local_a3c = out_shift_00;
  local_a38 = out_shift_00;
  local_a34 = out_shift_00;
  local_a30 = out_shift_00;
  local_a2c = out_shift_00;
  local_a28 = out_shift_00;
  local_a24 = out_shift_00;
  local_a00 = bd_00;
  local_9fc = bd_00;
  local_9f8 = bd_00;
  local_9f4 = bd_00;
  local_9f0 = bd_00;
  local_9ec = bd_00;
  local_9e8 = bd_00;
  local_9e4 = bd_00;
  local_9c0 = do_cols_00;
  local_9bc = do_cols_00;
  local_9b8 = do_cols_00;
  local_9b4 = do_cols_00;
  local_9b0 = do_cols_00;
  local_9ac = do_cols_00;
  local_9a8 = do_cols_00;
  local_9a4 = do_cols_00;
  local_980 = uVar44;
  local_97c = uVar44;
  local_978 = uVar44;
  local_974 = uVar44;
  local_970 = uVar44;
  local_96c = uVar44;
  local_968 = uVar44;
  local_964 = uVar44;
  local_940 = uVar45;
  local_93c = uVar45;
  local_938 = uVar45;
  local_934 = uVar45;
  local_930 = uVar45;
  local_92c = uVar45;
  local_928 = uVar45;
  local_924 = uVar45;
  local_900 = uVar46;
  local_8fc = uVar46;
  local_8f8 = uVar46;
  local_8f4 = uVar46;
  local_8f0 = uVar46;
  local_8ec = uVar46;
  local_8e8 = uVar46;
  local_8e4 = uVar46;
  local_8c0 = uVar47;
  local_8bc = uVar47;
  local_8b8 = uVar47;
  local_8b4 = uVar47;
  local_8b0 = uVar47;
  local_8ac = uVar47;
  local_8a8 = uVar47;
  local_8a4 = uVar47;
  local_880 = uVar48;
  local_87c = uVar48;
  local_878 = uVar48;
  local_874 = uVar48;
  local_870 = uVar48;
  local_86c = uVar48;
  local_868 = uVar48;
  local_864 = uVar48;
  local_840 = uVar49;
  local_83c = uVar49;
  local_838 = uVar49;
  local_834 = uVar49;
  local_830 = uVar49;
  local_82c = uVar49;
  local_828 = uVar49;
  local_824 = uVar49;
  local_800 = uVar50;
  local_7fc = uVar50;
  local_7f8 = uVar50;
  local_7f4 = uVar50;
  local_7f0 = uVar50;
  local_7ec = uVar50;
  local_7e8 = uVar50;
  local_7e4 = uVar50;
  local_7c0 = uVar51;
  local_7bc = uVar51;
  local_7b8 = uVar51;
  local_7b4 = uVar51;
  local_7b0 = uVar51;
  local_7ac = uVar51;
  local_7a8 = uVar51;
  local_7a4 = uVar51;
  local_780 = uVar52;
  local_77c = uVar52;
  local_778 = uVar52;
  local_774 = uVar52;
  local_770 = uVar52;
  local_76c = uVar52;
  local_768 = uVar52;
  local_764 = uVar52;
  local_740 = uVar53;
  local_73c = uVar53;
  local_738 = uVar53;
  local_734 = uVar53;
  local_730 = uVar53;
  local_72c = uVar53;
  local_728 = uVar53;
  local_724 = uVar53;
  local_700 = uVar54;
  local_6fc = uVar54;
  local_6f8 = uVar54;
  local_6f4 = uVar54;
  local_6f0 = uVar54;
  local_6ec = uVar54;
  local_6e8 = uVar54;
  local_6e4 = uVar54;
  local_6c0 = uVar55;
  local_6bc = uVar55;
  local_6b8 = uVar55;
  local_6b4 = uVar55;
  local_6b0 = uVar55;
  local_6ac = uVar55;
  local_6a8 = uVar55;
  local_6a4 = uVar55;
  local_680 = uVar56;
  local_67c = uVar56;
  local_678 = uVar56;
  local_674 = uVar56;
  local_670 = uVar56;
  local_66c = uVar56;
  local_668 = uVar56;
  local_664 = uVar56;
  local_640 = uVar57;
  local_63c = uVar57;
  local_638 = uVar57;
  local_634 = uVar57;
  local_630 = uVar57;
  local_62c = uVar57;
  local_628 = uVar57;
  local_624 = uVar57;
  local_600 = uVar58;
  local_5fc = uVar58;
  local_5f8 = uVar58;
  local_5f4 = uVar58;
  local_5f0 = uVar58;
  local_5ec = uVar58;
  local_5e8 = uVar58;
  local_5e4 = uVar58;
  local_5c0 = uVar59;
  local_5bc = uVar59;
  local_5b8 = uVar59;
  local_5b4 = uVar59;
  local_5b0 = uVar59;
  local_5ac = uVar59;
  local_5a8 = uVar59;
  local_5a4 = uVar59;
  local_580 = uVar60;
  local_57c = uVar60;
  local_578 = uVar60;
  local_574 = uVar60;
  local_570 = uVar60;
  local_56c = uVar60;
  local_568 = uVar60;
  local_564 = uVar60;
  local_540 = uVar5;
  local_53c = uVar5;
  local_538 = uVar5;
  local_534 = uVar5;
  local_530 = uVar5;
  local_52c = uVar5;
  local_528 = uVar5;
  local_524 = uVar5;
  local_500 = local_ef8;
  local_4fc = local_ef8;
  local_4f8 = local_ef8;
  local_4f4 = local_ef8;
  local_4f0 = local_ef8;
  local_4ec = local_ef8;
  local_4e8 = local_ef8;
  local_4e4 = local_ef8;
  local_4c0 = local_efc;
  local_4bc = local_efc;
  local_4b8 = local_efc;
  local_4b4 = local_efc;
  local_4b0 = local_efc;
  local_4ac = local_efc;
  local_4a8 = local_efc;
  local_4a4 = local_efc;
  local_480 = local_f00;
  local_47c = local_f00;
  local_478 = local_f00;
  local_474 = local_f00;
  local_470 = local_f00;
  local_46c = local_f00;
  local_468 = local_f00;
  local_464 = local_f00;
  local_440 = local_f04;
  local_43c = local_f04;
  local_438 = local_f04;
  local_434 = local_f04;
  local_430 = local_f04;
  local_42c = local_f04;
  local_428 = local_f04;
  local_424 = local_f04;
  local_400 = local_f08;
  local_3fc = local_f08;
  local_3f8 = local_f08;
  local_3f4 = local_f08;
  local_3f0 = local_f08;
  local_3ec = local_f08;
  local_3e8 = local_f08;
  local_3e4 = local_f08;
  local_3c0 = local_f0c;
  local_3bc = local_f0c;
  local_3b8 = local_f0c;
  local_3b4 = local_f0c;
  local_3b0 = local_f0c;
  local_3ac = local_f0c;
  local_3a8 = local_f0c;
  local_3a4 = local_f0c;
  local_380 = local_f10;
  local_37c = local_f10;
  local_378 = local_f10;
  local_374 = local_f10;
  local_370 = local_f10;
  local_36c = local_f10;
  local_368 = local_f10;
  local_364 = local_f10;
  local_340 = local_f14;
  local_33c = local_f14;
  local_338 = local_f14;
  local_334 = local_f14;
  local_330 = local_f14;
  local_32c = local_f14;
  local_328 = local_f14;
  local_324 = local_f14;
  local_300 = local_f18;
  local_2fc = local_f18;
  local_2f8 = local_f18;
  local_2f4 = local_f18;
  local_2f0 = local_f18;
  local_2ec = local_f18;
  local_2e8 = local_f18;
  local_2e4 = local_f18;
  local_2c0 = local_f1c;
  local_2bc = local_f1c;
  local_2b8 = local_f1c;
  local_2b4 = local_f1c;
  local_2b0 = local_f1c;
  local_2ac = local_f1c;
  local_2a8 = local_f1c;
  local_2a4 = local_f1c;
  local_280 = local_f20;
  local_27c = local_f20;
  local_278 = local_f20;
  local_274 = local_f20;
  local_270 = local_f20;
  local_26c = local_f20;
  local_268 = local_f20;
  local_264 = local_f20;
  local_240 = local_f24;
  local_23c = local_f24;
  local_238 = local_f24;
  local_234 = local_f24;
  local_230 = local_f24;
  local_22c = local_f24;
  local_228 = local_f24;
  local_224 = local_f24;
  local_200 = local_f28;
  local_1fc = local_f28;
  local_1f8 = local_f28;
  local_1f4 = local_f28;
  local_1f0 = local_f28;
  local_1ec = local_f28;
  local_1e8 = local_f28;
  local_1e4 = local_f28;
  local_1c0 = local_f2c;
  local_1bc = local_f2c;
  local_1b8 = local_f2c;
  local_1b4 = local_f2c;
  local_1b0 = local_f2c;
  local_1ac = local_f2c;
  local_1a8 = local_f2c;
  local_1a4 = local_f2c;
  local_180 = local_f30;
  local_17c = local_f30;
  local_178 = local_f30;
  local_174 = local_f30;
  local_170 = local_f30;
  local_16c = local_f30;
  local_168 = local_f30;
  local_164 = local_f30;
  local_140 = local_f34;
  local_13c = local_f34;
  local_138 = local_f34;
  local_134 = local_f34;
  local_130 = local_f34;
  local_12c = local_f34;
  local_128 = local_f34;
  local_124 = local_f34;
  local_100 = local_f38;
  local_fc = local_f38;
  local_f8 = local_f38;
  local_f4 = local_f38;
  local_f0 = local_f38;
  local_ec = local_f38;
  local_e8 = local_f38;
  local_e4 = local_f38;
  local_c0 = local_f3c;
  local_bc = local_f3c;
  local_b8 = local_f3c;
  local_b4 = local_f3c;
  local_b0 = local_f3c;
  local_ac = local_f3c;
  local_a8 = local_f3c;
  local_a4 = local_f3c;
  local_80 = local_f40;
  local_7c = local_f40;
  local_78 = local_f40;
  local_74 = local_f40;
  local_70 = local_f40;
  local_6c = local_f40;
  local_68 = local_f40;
  local_64 = local_f40;
  local_40 = local_f44;
  local_3c = local_f44;
  local_38 = local_f44;
  local_34 = local_f44;
  local_30 = local_f44;
  local_2c = local_f44;
  local_28 = local_f44;
  local_24 = local_f44;
  local_fa0 = local_e60._0_16_;
  auStack_f90 = local_e60._16_16_;
  local_16c0 = local_60._0_16_;
  auStack_16b0 = local_60._16_16_;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_16e0 = uVar8;
  uStack_16d8 = uVar14;
  uStack_16d0 = uVar20;
  uStack_16c8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1ac0 = uVar8;
  uStack_1ab8 = uVar14;
  uStack_1ab0 = uVar20;
  uStack_1aa8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1a60 = uVar8;
  uStack_1a58 = uVar14;
  uStack_1a50 = uVar20;
  uStack_1a48 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1740 = uVar8;
  uStack_1738 = uVar14;
  uStack_1730 = uVar20;
  uStack_1728 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1760 = uVar8;
  uStack_1758 = uVar14;
  uStack_1750 = uVar20;
  uStack_1748 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1a40 = uVar8;
  uStack_1a38 = uVar14;
  uStack_1a30 = uVar20;
  uStack_1a28 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_19e0 = uVar8;
  uStack_19d8 = uVar14;
  uStack_19d0 = uVar20;
  uStack_19c8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_17c0 = uVar8;
  uStack_17b8 = uVar14;
  uStack_17b0 = uVar20;
  uStack_17a8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_17e0 = uVar8;
  uStack_17d8 = uVar14;
  uStack_17d0 = uVar20;
  uStack_17c8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_19c0 = uVar8;
  uStack_19b8 = uVar14;
  uStack_19b0 = uVar20;
  uStack_19a8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1960 = uVar8;
  uStack_1958 = uVar14;
  uStack_1950 = uVar20;
  uStack_1948 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1840 = uVar8;
  uStack_1838 = uVar14;
  uStack_1830 = uVar20;
  uStack_1828 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_18e0 = uVar8;
  uStack_18d8 = uVar14;
  uStack_18d0 = uVar20;
  uStack_18c8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_18c0 = uVar8;
  uStack_18b8 = uVar14;
  uStack_18b0 = uVar20;
  uStack_18a8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1860 = uVar8;
  uStack_1858 = uVar14;
  uStack_1850 = uVar20;
  uStack_1848 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1940 = uVar8;
  uStack_1938 = uVar14;
  uStack_1930 = uVar20;
  uStack_1928 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1ae0 = uVar8;
  uStack_1ad8 = uVar14;
  uStack_1ad0 = uVar20;
  uStack_1ac8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1cc0 = uVar8;
  uStack_1cb8 = uVar14;
  uStack_1cb0 = uVar20;
  uStack_1ca8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1c60 = uVar8;
  uStack_1c58 = uVar14;
  uStack_1c50 = uVar20;
  uStack_1c48 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1b40 = uVar8;
  uStack_1b38 = uVar14;
  uStack_1b30 = uVar20;
  uStack_1b28 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1b60 = uVar8;
  uStack_1b58 = uVar14;
  uStack_1b50 = uVar20;
  uStack_1b48 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1c40 = uVar8;
  uStack_1c38 = uVar14;
  uStack_1c30 = uVar20;
  uStack_1c28 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1be0 = uVar8;
  uStack_1bd8 = uVar14;
  uStack_1bd0 = uVar20;
  uStack_1bc8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1aa0 = local_1ac0;
  uStack_1a98 = uStack_1ab8;
  uStack_1a90 = uStack_1ab0;
  uStack_1a88 = uStack_1aa8;
  local_1a80 = local_1a60;
  uStack_1a78 = uStack_1a58;
  uStack_1a70 = uStack_1a50;
  uStack_1a68 = uStack_1a48;
  local_1a20 = local_1a40;
  uStack_1a18 = uStack_1a38;
  uStack_1a10 = uStack_1a30;
  uStack_1a08 = uStack_1a28;
  local_1a00 = local_19e0;
  uStack_19f8 = uStack_19d8;
  uStack_19f0 = uStack_19d0;
  uStack_19e8 = uStack_19c8;
  local_19a0 = local_19c0;
  uStack_1998 = uStack_19b8;
  uStack_1990 = uStack_19b0;
  uStack_1988 = uStack_19a8;
  local_1980 = local_1960;
  uStack_1978 = uStack_1958;
  uStack_1970 = uStack_1950;
  uStack_1968 = uStack_1948;
  local_1920 = local_1940;
  uStack_1918 = uStack_1938;
  uStack_1910 = uStack_1930;
  uStack_1908 = uStack_1928;
  local_1900 = local_18e0;
  uStack_18f8 = uStack_18d8;
  uStack_18f0 = uStack_18d0;
  uStack_18e8 = uStack_18c8;
  local_18a0 = local_18c0;
  uStack_1898 = uStack_18b8;
  uStack_1890 = uStack_18b0;
  uStack_1888 = uStack_18a8;
  local_1880 = local_1860;
  uStack_1878 = uStack_1858;
  uStack_1870 = uStack_1850;
  uStack_1868 = uStack_1848;
  local_1820 = local_1840;
  uStack_1818 = uStack_1838;
  uStack_1810 = uStack_1830;
  uStack_1808 = uStack_1828;
  local_1800 = local_17e0;
  uStack_17f8 = uStack_17d8;
  uStack_17f0 = uStack_17d0;
  uStack_17e8 = uStack_17c8;
  local_17a0 = local_17c0;
  uStack_1798 = uStack_17b8;
  uStack_1790 = uStack_17b0;
  uStack_1788 = uStack_17a8;
  local_1780 = local_1760;
  uStack_1778 = uStack_1758;
  uStack_1770 = uStack_1750;
  uStack_1768 = uStack_1748;
  local_1720 = local_1740;
  uStack_1718 = uStack_1738;
  uStack_1710 = uStack_1730;
  uStack_1708 = uStack_1728;
  local_1700 = local_16e0;
  uStack_16f8 = uStack_16d8;
  uStack_16f0 = uStack_16d0;
  uStack_16e8 = uStack_16c8;
  uVar9 = local_16e0;
  uVar15 = uStack_16d8;
  uVar21 = uStack_16d0;
  uVar27 = uStack_16c8;
  local_1bc0 = uVar8;
  uStack_1bb8 = uVar14;
  uStack_1bb0 = uVar20;
  uStack_1ba8 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1ce0 = uVar9;
  uStack_1cd8 = uVar15;
  uStack_1cd0 = uVar21;
  uStack_1cc8 = uVar27;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1dc0 = uVar9;
  uStack_1db8 = uVar15;
  uStack_1db0 = uVar21;
  uStack_1da8 = uVar27;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1d60 = uVar9;
  uStack_1d58 = uVar15;
  uStack_1d50 = uVar21;
  uStack_1d48 = uVar27;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1ca0 = local_1cc0;
  uStack_1c98 = uStack_1cb8;
  uStack_1c90 = uStack_1cb0;
  uStack_1c88 = uStack_1ca8;
  local_1c80 = local_1c60;
  uStack_1c78 = uStack_1c58;
  uStack_1c70 = uStack_1c50;
  uStack_1c68 = uStack_1c48;
  local_1c20 = local_1c40;
  uStack_1c18 = uStack_1c38;
  uStack_1c10 = uStack_1c30;
  uStack_1c08 = uStack_1c28;
  local_1c00 = local_1be0;
  uStack_1bf8 = uStack_1bd8;
  uStack_1bf0 = uStack_1bd0;
  uStack_1be8 = uStack_1bc8;
  local_1ba0 = local_1bc0;
  uStack_1b98 = uStack_1bb8;
  uStack_1b90 = uStack_1bb0;
  uStack_1b88 = uStack_1ba8;
  local_1b80 = local_1b60;
  uStack_1b78 = uStack_1b58;
  uStack_1b70 = uStack_1b50;
  uStack_1b68 = uStack_1b48;
  local_1b20 = local_1b40;
  uStack_1b18 = uStack_1b38;
  uStack_1b10 = uStack_1b30;
  uStack_1b08 = uStack_1b28;
  local_1b00 = local_1ae0;
  uStack_1af8 = uStack_1ad8;
  uStack_1af0 = uStack_1ad0;
  uStack_1ae8 = uStack_1ac8;
  uVar8 = local_1ae0;
  uVar14 = uStack_1ad8;
  uVar20 = uStack_1ad0;
  uVar26 = uStack_1ac8;
  local_1d40 = uVar9;
  uStack_1d38 = uVar15;
  uStack_1d30 = uVar21;
  uStack_1d28 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar9 = uVar8;
  uVar15 = uVar14;
  uVar21 = uVar20;
  uVar27 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar10 = uVar9;
  uVar16 = uVar15;
  uVar22 = uVar21;
  uVar28 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar11 = uVar10;
  uVar17 = uVar16;
  uVar23 = uVar22;
  uVar29 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar12 = uVar11;
  uVar18 = uVar17;
  uVar24 = uVar23;
  uVar30 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_17a0 = uVar12;
  uStack_1798 = uVar18;
  uStack_1790 = uVar24;
  uStack_1788 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1780 = uVar12;
  uStack_1778 = uVar18;
  uStack_1770 = uVar24;
  uStack_1768 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1720 = uVar12;
  uStack_1718 = uVar18;
  uStack_1710 = uVar24;
  uStack_1708 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1aa0 = uVar8;
  uStack_1a98 = uVar14;
  uStack_1a90 = uVar20;
  uStack_1a88 = uVar26;
  local_1a80 = uVar9;
  uStack_1a78 = uVar15;
  uStack_1a70 = uVar21;
  uStack_1a68 = uVar27;
  local_1a20 = uVar10;
  uStack_1a18 = uVar16;
  uStack_1a10 = uVar22;
  uStack_1a08 = uVar28;
  local_1a00 = uVar11;
  uStack_19f8 = uVar17;
  uStack_19f0 = uVar23;
  uStack_19e8 = uVar29;
  local_1700 = uVar12;
  uStack_16f8 = uVar18;
  uStack_16f0 = uVar24;
  uStack_16e8 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar11;
  uVar14 = uVar17;
  uVar20 = uVar23;
  uVar26 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar9 = uVar8;
  uVar15 = uVar14;
  uVar21 = uVar20;
  uVar27 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar10 = uVar9;
  uVar16 = uVar15;
  uVar22 = uVar21;
  uVar28 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar12 = uVar10;
  uVar18 = uVar16;
  uVar24 = uVar22;
  uVar30 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_18a0 = uVar12;
  uStack_1898 = uVar18;
  uStack_1890 = uVar24;
  uStack_1888 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1880 = uVar12;
  uStack_1878 = uVar18;
  uStack_1870 = uVar24;
  uStack_1868 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1820 = uVar12;
  uStack_1818 = uVar18;
  uStack_1810 = uVar24;
  uStack_1808 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_19a0 = uVar11;
  uStack_1998 = uVar17;
  uStack_1990 = uVar23;
  uStack_1988 = uVar29;
  local_1980 = uVar8;
  uStack_1978 = uVar14;
  uStack_1970 = uVar20;
  uStack_1968 = uVar26;
  local_1920 = uVar9;
  uStack_1918 = uVar15;
  uStack_1910 = uVar21;
  uStack_1908 = uVar27;
  local_1900 = uVar10;
  uStack_18f8 = uVar16;
  uStack_18f0 = uVar22;
  uStack_18e8 = uVar28;
  local_1800 = uVar12;
  uStack_17f8 = uVar18;
  uStack_17f0 = uVar24;
  uStack_17e8 = uVar30;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1de0 = uVar10;
  uStack_1dd8 = uVar16;
  uStack_1dd0 = uVar22;
  uStack_1dc8 = uVar28;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),
                  (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20));
  local_1da0 = local_1dc0;
  uStack_1d98 = uStack_1db8;
  uStack_1d90 = uStack_1db0;
  uStack_1d88 = uStack_1da8;
  local_1d80 = local_1d60;
  uStack_1d78 = uStack_1d58;
  uStack_1d70 = uStack_1d50;
  uStack_1d68 = uStack_1d48;
  local_1d20 = local_1d40;
  uStack_1d18 = uStack_1d38;
  uStack_1d10 = uStack_1d30;
  uStack_1d08 = uStack_1d28;
  local_1d00 = local_1ce0;
  uStack_1cf8 = uStack_1cd8;
  uStack_1cf0 = uStack_1cd0;
  uStack_1ce8 = uStack_1cc8;
  uVar9 = local_1ce0;
  uVar15 = uStack_1cd8;
  uVar21 = uStack_1cd0;
  uVar27 = uStack_1cc8;
  local_1e40 = uVar10;
  uStack_1e38 = uVar16;
  uStack_1e30 = uVar22;
  uStack_1e28 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar10 = uVar9;
  uVar16 = uVar15;
  uVar22 = uVar21;
  uVar28 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar11 = uVar10;
  uVar17 = uVar16;
  uVar23 = uVar22;
  uVar29 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar11;
  uVar14 = uVar17;
  uVar20 = uVar23;
  uVar26 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar12 = uVar8;
  uVar18 = uVar14;
  uVar24 = uVar20;
  uVar30 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1ba0 = uVar12;
  uStack_1b98 = uVar18;
  uStack_1b90 = uVar24;
  uStack_1b88 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1b80 = uVar12;
  uStack_1b78 = uVar18;
  uStack_1b70 = uVar24;
  uStack_1b68 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1b20 = uVar12;
  uStack_1b18 = uVar18;
  uStack_1b10 = uVar24;
  uStack_1b08 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1ca0 = uVar9;
  uStack_1c98 = uVar15;
  uStack_1c90 = uVar21;
  uStack_1c88 = uVar27;
  local_1c80 = uVar10;
  uStack_1c78 = uVar16;
  uStack_1c70 = uVar22;
  uStack_1c68 = uVar28;
  local_1c20 = uVar11;
  uStack_1c18 = uVar17;
  uStack_1c10 = uVar23;
  uStack_1c08 = uVar29;
  local_1c00 = uVar8;
  uStack_1bf8 = uVar14;
  uStack_1bf0 = uVar20;
  uStack_1be8 = uVar26;
  local_1b00 = uVar12;
  uStack_1af8 = uVar18;
  uStack_1af0 = uVar24;
  uStack_1ae8 = uVar30;
  for (local_f6c = 0x20; iVar3 = (int)((ulong)in_stack_ffffffffffffdfb8 >> 0x20), local_f6c < 0x40;
      local_f6c = local_f6c + 8) {
    in0[0]._4_4_ = do_cols_00;
    in0[0]._0_4_ = bd_00;
    in0[1]._0_4_ = uVar44;
    in0[1]._4_4_ = uVar45;
    in0[2]._0_4_ = uVar46;
    in0[2]._4_4_ = uVar47;
    in0[3]._0_4_ = uVar48;
    in0[3]._4_4_ = uVar49;
    in1[0]._4_4_ = uVar38;
    in1[0]._0_4_ = uVar37;
    in1[1]._0_4_ = uVar39;
    in1[1]._4_4_ = uVar40;
    in1[2]._0_4_ = uVar41;
    in1[2]._4_4_ = uVar42;
    in1[3]._0_4_ = uVar43;
    in1[3]._4_4_ = out_shift_00;
    addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
    in0_00[0]._4_4_ = do_cols_00;
    in0_00[0]._0_4_ = bd_00;
    in0_00[1]._0_4_ = uVar44;
    in0_00[1]._4_4_ = uVar45;
    in0_00[2]._0_4_ = uVar46;
    in0_00[2]._4_4_ = uVar47;
    in0_00[3]._0_4_ = uVar48;
    in0_00[3]._4_4_ = uVar49;
    in1_00[0]._4_4_ = uVar38;
    in1_00[0]._0_4_ = uVar37;
    in1_00[1]._0_4_ = uVar39;
    in1_00[1]._4_4_ = uVar40;
    in1_00[2]._0_4_ = uVar41;
    in1_00[2]._4_4_ = uVar42;
    in1_00[3]._0_4_ = uVar43;
    in1_00[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
    in0_01[0]._4_4_ = do_cols_00;
    in0_01[0]._0_4_ = bd_00;
    in0_01[1]._0_4_ = uVar44;
    in0_01[1]._4_4_ = uVar45;
    in0_01[2]._0_4_ = uVar46;
    in0_01[2]._4_4_ = uVar47;
    in0_01[3]._0_4_ = uVar48;
    in0_01[3]._4_4_ = uVar49;
    in1_01[0]._4_4_ = uVar38;
    in1_01[0]._0_4_ = uVar37;
    in1_01[1]._0_4_ = uVar39;
    in1_01[1]._4_4_ = uVar40;
    in1_01[2]._0_4_ = uVar41;
    in1_01[2]._4_4_ = uVar42;
    in1_01[3]._0_4_ = uVar43;
    in1_01[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
    lVar7 = (long)(local_f6c + 6);
    uVar8 = local_1ec0[lVar7 * 4];
    uVar14 = local_1ec0[lVar7 * 4 + 1];
    uVar20 = local_1ec0[lVar7 * 4 + 2];
    uVar26 = local_1ec0[lVar7 * 4 + 3];
    in0_02[0]._4_4_ = do_cols_00;
    in0_02[0]._0_4_ = bd_00;
    in0_02[1]._0_4_ = uVar44;
    in0_02[1]._4_4_ = uVar45;
    in0_02[2]._0_4_ = uVar46;
    in0_02[2]._4_4_ = uVar47;
    in0_02[3]._0_4_ = uVar48;
    in0_02[3]._4_4_ = uVar49;
    in1_02[0]._4_4_ = uVar38;
    in1_02[0]._0_4_ = uVar37;
    in1_02[1]._0_4_ = uVar39;
    in1_02[1]._4_4_ = uVar40;
    in1_02[2]._0_4_ = uVar41;
    in1_02[2]._4_4_ = uVar42;
    in1_02[3]._0_4_ = uVar43;
    in1_02[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  }
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),iVar3);
  uVar10 = uVar8;
  uVar16 = uVar14;
  uVar22 = uVar20;
  uVar28 = uVar26;
  half_btf_0_avx2(in_stack_ffffffffffffdfd0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0),iVar3);
  local_1e20 = local_1e40;
  uStack_1e18 = uStack_1e38;
  uStack_1e10 = uStack_1e30;
  uStack_1e08 = uStack_1e28;
  local_1e00 = local_1de0;
  uStack_1df8 = uStack_1dd8;
  uStack_1df0 = uStack_1dd0;
  uStack_1de8 = uStack_1dc8;
  uVar9 = local_1de0;
  uVar15 = uStack_1dd8;
  uVar21 = uStack_1dd0;
  uVar27 = uStack_1dc8;
  local_1ec0[0] = uVar8;
  local_1ec0[1] = uVar14;
  local_1ec0[2] = uVar20;
  local_1ec0[3] = uVar26;
  local_1ea0 = uVar10;
  uStack_1e98 = uVar16;
  uStack_1e90 = uVar22;
  uStack_1e88 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar9;
  uVar14 = uVar15;
  uVar20 = uVar21;
  uVar26 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1da0 = uVar9;
  uStack_1d98 = uVar15;
  uStack_1d90 = uVar21;
  uStack_1d88 = uVar27;
  local_1d00 = uVar8;
  uStack_1cf8 = uVar14;
  uStack_1cf0 = uVar20;
  uStack_1ce8 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar9;
  uVar14 = uVar15;
  uVar20 = uVar21;
  uVar26 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1d80 = uVar9;
  uStack_1d78 = uVar15;
  uStack_1d70 = uVar21;
  uStack_1d68 = uVar27;
  local_1d20 = uVar8;
  uStack_1d18 = uVar14;
  uStack_1d10 = uVar20;
  uStack_1d08 = uVar26;
  for (local_f6c = 0x10; local_f6c < 0x20; local_f6c = local_f6c + 8) {
    in0_03[0]._4_4_ = do_cols_00;
    in0_03[0]._0_4_ = bd_00;
    in0_03[1]._0_4_ = uVar44;
    in0_03[1]._4_4_ = uVar45;
    in0_03[2]._0_4_ = uVar46;
    in0_03[2]._4_4_ = uVar47;
    in0_03[3]._0_4_ = uVar48;
    in0_03[3]._4_4_ = uVar49;
    in1_03[0]._4_4_ = uVar38;
    in1_03[0]._0_4_ = uVar37;
    in1_03[1]._0_4_ = uVar39;
    in1_03[1]._4_4_ = uVar40;
    in1_03[2]._0_4_ = uVar41;
    in1_03[2]._4_4_ = uVar42;
    in1_03[3]._0_4_ = uVar43;
    in1_03[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
    in0_04[0]._4_4_ = do_cols_00;
    in0_04[0]._0_4_ = bd_00;
    in0_04[1]._0_4_ = uVar44;
    in0_04[1]._4_4_ = uVar45;
    in0_04[2]._0_4_ = uVar46;
    in0_04[2]._4_4_ = uVar47;
    in0_04[3]._0_4_ = uVar48;
    in0_04[3]._4_4_ = uVar49;
    in1_04[0]._4_4_ = uVar38;
    in1_04[0]._0_4_ = uVar37;
    in1_04[1]._0_4_ = uVar39;
    in1_04[1]._4_4_ = uVar40;
    in1_04[2]._0_4_ = uVar41;
    in1_04[2]._4_4_ = uVar42;
    in1_04[3]._0_4_ = uVar43;
    in1_04[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
    in0_05[0]._4_4_ = do_cols_00;
    in0_05[0]._0_4_ = bd_00;
    in0_05[1]._0_4_ = uVar44;
    in0_05[1]._4_4_ = uVar45;
    in0_05[2]._0_4_ = uVar46;
    in0_05[2]._4_4_ = uVar47;
    in0_05[3]._0_4_ = uVar48;
    in0_05[3]._4_4_ = uVar49;
    in1_05[0]._4_4_ = uVar38;
    in1_05[0]._0_4_ = uVar37;
    in1_05[1]._0_4_ = uVar39;
    in1_05[1]._4_4_ = uVar40;
    in1_05[2]._0_4_ = uVar41;
    in1_05[2]._4_4_ = uVar42;
    in1_05[3]._0_4_ = uVar43;
    in1_05[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
    lVar7 = (long)(local_f6c + 6);
    uVar9 = local_1ec0[lVar7 * 4];
    uVar15 = local_1ec0[lVar7 * 4 + 1];
    uVar21 = local_1ec0[lVar7 * 4 + 2];
    uVar27 = local_1ec0[lVar7 * 4 + 3];
    in0_06[0]._4_4_ = do_cols_00;
    in0_06[0]._0_4_ = bd_00;
    in0_06[1]._0_4_ = uVar44;
    in0_06[1]._4_4_ = uVar45;
    in0_06[2]._0_4_ = uVar46;
    in0_06[2]._4_4_ = uVar47;
    in0_06[3]._0_4_ = uVar48;
    in0_06[3]._4_4_ = uVar49;
    in1_06[0]._4_4_ = uVar38;
    in1_06[0]._0_4_ = uVar37;
    in1_06[1]._0_4_ = uVar39;
    in1_06[1]._4_4_ = uVar40;
    in1_06[2]._0_4_ = uVar41;
    in1_06[2]._4_4_ = uVar42;
    in1_06[3]._0_4_ = uVar43;
    in1_06[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  }
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar9;
  uVar14 = uVar15;
  uVar20 = uVar21;
  uVar26 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar10 = uVar8;
  uVar16 = uVar14;
  uVar22 = uVar20;
  uVar28 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar13 = uVar10;
  uVar19 = uVar16;
  uVar25 = uVar22;
  uVar31 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar11 = uVar13;
  uVar17 = uVar19;
  uVar23 = uVar25;
  uVar29 = uVar31;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1780 = uVar11;
  uStack_1778 = uVar17;
  uStack_1770 = uVar23;
  uStack_1768 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1760 = uVar11;
  uStack_1758 = uVar17;
  uStack_1750 = uVar23;
  uStack_1748 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1740 = uVar11;
  uStack_1738 = uVar17;
  uStack_1730 = uVar23;
  uStack_1728 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1a80 = uVar9;
  uStack_1a78 = uVar15;
  uStack_1a70 = uVar21;
  uStack_1a68 = uVar27;
  local_1a60 = uVar8;
  uStack_1a58 = uVar14;
  uStack_1a50 = uVar20;
  uStack_1a48 = uVar26;
  local_1a40 = uVar10;
  uStack_1a38 = uVar16;
  uStack_1a30 = uVar22;
  uStack_1a28 = uVar28;
  local_1a20 = uVar13;
  uStack_1a18 = uVar19;
  uStack_1a10 = uVar25;
  uStack_1a08 = uVar31;
  local_1720 = uVar11;
  uStack_1718 = uVar17;
  uStack_1710 = uVar23;
  uStack_1708 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar13;
  uVar14 = uVar19;
  uVar20 = uVar25;
  uVar26 = uVar31;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar9 = uVar8;
  uVar15 = uVar14;
  uVar21 = uVar20;
  uVar27 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar10 = uVar9;
  uVar16 = uVar15;
  uVar22 = uVar21;
  uVar28 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar11 = uVar10;
  uVar17 = uVar16;
  uVar23 = uVar22;
  uVar29 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1880 = uVar11;
  uStack_1878 = uVar17;
  uStack_1870 = uVar23;
  uStack_1868 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1860 = uVar11;
  uStack_1858 = uVar17;
  uStack_1850 = uVar23;
  uStack_1848 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1840 = uVar11;
  uStack_1838 = uVar17;
  uStack_1830 = uVar23;
  uStack_1828 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1e60 = local_1ec0[0];
  uStack_1e58 = local_1ec0[1];
  uStack_1e50 = local_1ec0[2];
  uStack_1e48 = local_1ec0[3];
  local_1e80 = local_1ea0;
  uStack_1e78 = uStack_1e98;
  uStack_1e70 = uStack_1e90;
  uStack_1e68 = uStack_1e88;
  uVar12 = local_1ea0;
  uVar18 = uStack_1e98;
  uVar24 = uStack_1e90;
  uVar30 = uStack_1e88;
  local_1980 = uVar13;
  uStack_1978 = uVar19;
  uStack_1970 = uVar25;
  uStack_1968 = uVar31;
  local_1960 = uVar8;
  uStack_1958 = uVar14;
  uStack_1950 = uVar20;
  uStack_1948 = uVar26;
  local_1940 = uVar9;
  uStack_1938 = uVar15;
  uStack_1930 = uVar21;
  uStack_1928 = uVar27;
  local_1920 = uVar10;
  uStack_1918 = uVar16;
  uStack_1910 = uVar22;
  uStack_1908 = uVar28;
  local_1820 = uVar11;
  uStack_1818 = uVar17;
  uStack_1810 = uVar23;
  uStack_1808 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar8 = uVar12;
  uVar14 = uVar18;
  uVar20 = uVar24;
  uVar26 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  in0_07[0]._4_4_ = do_cols_00;
  in0_07[0]._0_4_ = bd_00;
  in0_07[1]._0_4_ = uVar44;
  in0_07[1]._4_4_ = uVar45;
  in0_07[2]._0_4_ = uVar46;
  in0_07[2]._4_4_ = uVar47;
  in0_07[3]._0_4_ = uVar48;
  in0_07[3]._4_4_ = uVar49;
  in1_07[0]._4_4_ = uVar38;
  in1_07[0]._0_4_ = uVar37;
  in1_07[1]._0_4_ = uVar39;
  in1_07[1]._4_4_ = uVar40;
  in1_07[2]._0_4_ = uVar41;
  in1_07[2]._4_4_ = uVar42;
  in1_07[3]._0_4_ = uVar43;
  in1_07[3]._4_4_ = out_shift_00;
  local_1e20 = uVar12;
  uStack_1e18 = uVar18;
  uStack_1e10 = uVar24;
  uStack_1e08 = uVar30;
  local_1e00 = uVar8;
  uStack_1df8 = uVar14;
  uStack_1df0 = uVar20;
  uStack_1de8 = uVar26;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
              (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  in0_08[0]._4_4_ = do_cols_00;
  in0_08[0]._0_4_ = bd_00;
  in0_08[1]._0_4_ = uVar44;
  in0_08[1]._4_4_ = uVar45;
  in0_08[2]._0_4_ = uVar46;
  in0_08[2]._4_4_ = uVar47;
  in0_08[3]._0_4_ = uVar48;
  in0_08[3]._4_4_ = uVar49;
  in1_08[0]._4_4_ = uVar38;
  in1_08[0]._0_4_ = uVar37;
  in1_08[1]._0_4_ = uVar39;
  in1_08[1]._4_4_ = uVar40;
  in1_08[2]._0_4_ = uVar41;
  in1_08[2]._4_4_ = uVar42;
  in1_08[3]._0_4_ = uVar43;
  in1_08[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
              (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  in0_09[0]._4_4_ = do_cols_00;
  in0_09[0]._0_4_ = bd_00;
  in0_09[1]._0_4_ = uVar44;
  in0_09[1]._4_4_ = uVar45;
  in0_09[2]._0_4_ = uVar46;
  in0_09[2]._4_4_ = uVar47;
  in0_09[3]._0_4_ = uVar48;
  in0_09[3]._4_4_ = uVar49;
  in1_09[0]._4_4_ = uVar38;
  in1_09[0]._0_4_ = uVar37;
  in1_09[1]._0_4_ = uVar39;
  in1_09[1]._4_4_ = uVar40;
  in1_09[2]._0_4_ = uVar41;
  in1_09[2]._4_4_ = uVar42;
  in1_09[3]._0_4_ = uVar43;
  in1_09[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
              (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  in0_10[0]._4_4_ = do_cols_00;
  in0_10[0]._0_4_ = bd_00;
  in0_10[1]._0_4_ = uVar44;
  in0_10[1]._4_4_ = uVar45;
  in0_10[2]._0_4_ = uVar46;
  in0_10[2]._4_4_ = uVar47;
  in0_10[3]._0_4_ = uVar48;
  in0_10[3]._4_4_ = uVar49;
  in1_10[0]._4_4_ = uVar38;
  in1_10[0]._0_4_ = uVar37;
  in1_10[1]._0_4_ = uVar39;
  in1_10[1]._4_4_ = uVar40;
  in1_10[2]._0_4_ = uVar41;
  in1_10[2]._4_4_ = uVar42;
  in1_10[3]._0_4_ = uVar43;
  in1_10[3]._4_4_ = out_shift_00;
  uVar8 = local_1d00;
  uVar14 = uStack_1cf8;
  uVar20 = uStack_1cf0;
  uVar26 = uStack_1ce8;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
              (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar9 = uVar8;
  uVar15 = uVar14;
  uVar21 = uVar20;
  uVar27 = uVar26;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar10 = uVar9;
  uVar16 = uVar15;
  uVar22 = uVar21;
  uVar28 = uVar27;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar11 = uVar10;
  uVar17 = uVar16;
  uVar23 = uVar22;
  uVar29 = uVar28;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  uVar12 = uVar11;
  uVar18 = uVar17;
  uVar24 = uVar23;
  uVar30 = uVar29;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1b80 = uVar12;
  uStack_1b78 = uVar18;
  uStack_1b70 = uVar24;
  uStack_1b68 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1b60 = uVar12;
  uStack_1b58 = uVar18;
  uStack_1b50 = uVar24;
  uStack_1b48 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1b40 = uVar12;
  uStack_1b38 = uVar18;
  uStack_1b30 = uVar24;
  uStack_1b28 = uVar30;
  half_btf_avx2((__m256i *)CONCAT44(out_shift_00,uVar43),(__m256i *)CONCAT44(uVar42,uVar41),
                (__m256i *)CONCAT44(uVar40,uVar39),(__m256i *)CONCAT44(uVar38,uVar37),
                (__m256i *)CONCAT44(uVar36,uVar35),bit_00);
  local_1c80 = uVar8;
  uStack_1c78 = uVar14;
  uStack_1c70 = uVar20;
  uStack_1c68 = uVar26;
  local_1c60 = uVar9;
  uStack_1c58 = uVar15;
  uStack_1c50 = uVar21;
  uStack_1c48 = uVar27;
  local_1c40 = uVar10;
  uStack_1c38 = uVar16;
  uStack_1c30 = uVar22;
  uStack_1c28 = uVar28;
  local_1c20 = uVar11;
  uStack_1c18 = uVar17;
  uStack_1c10 = uVar23;
  uStack_1c08 = uVar29;
  local_1b20 = uVar12;
  uStack_1b18 = uVar18;
  uStack_1b10 = uVar24;
  uStack_1b08 = uVar30;
  for (local_f6c = 0x20; local_f6c < 0x40; local_f6c = local_f6c + 0x10) {
    for (local_f70 = local_f6c; local_f70 < local_f6c + 4; local_f70 = local_f70 + 1) {
      in0_11[0]._4_4_ = do_cols_00;
      in0_11[0]._0_4_ = bd_00;
      in0_11[1]._0_4_ = uVar44;
      in0_11[1]._4_4_ = uVar45;
      in0_11[2]._0_4_ = uVar46;
      in0_11[2]._4_4_ = uVar47;
      in0_11[3]._0_4_ = uVar48;
      in0_11[3]._4_4_ = uVar49;
      in1_11[0]._4_4_ = uVar38;
      in1_11[0]._0_4_ = uVar37;
      in1_11[1]._0_4_ = uVar39;
      in1_11[1]._4_4_ = uVar40;
      in1_11[2]._0_4_ = uVar41;
      in1_11[2]._4_4_ = uVar42;
      in1_11[3]._0_4_ = uVar43;
      in1_11[3]._4_4_ = out_shift_00;
      addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar36,uVar35),
                  (__m256i *)CONCAT44(bit_00,uVar34),(__m256i *)CONCAT44(uVar33,uVar32),
                  (__m256i *)CONCAT44(uVar4,uVar6));
      in0_12[0]._4_4_ = do_cols_00;
      in0_12[0]._0_4_ = bd_00;
      in0_12[1]._0_4_ = uVar44;
      in0_12[1]._4_4_ = uVar45;
      in0_12[2]._0_4_ = uVar46;
      in0_12[2]._4_4_ = uVar47;
      in0_12[3]._0_4_ = uVar48;
      in0_12[3]._4_4_ = uVar49;
      in1_12[0]._4_4_ = uVar38;
      in1_12[0]._0_4_ = uVar37;
      in1_12[1]._0_4_ = uVar39;
      in1_12[1]._4_4_ = uVar40;
      in1_12[2]._0_4_ = uVar41;
      in1_12[2]._4_4_ = uVar42;
      in1_12[3]._0_4_ = uVar43;
      in1_12[3]._4_4_ = out_shift_00;
      addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar36,uVar35),
                  (__m256i *)CONCAT44(bit_00,uVar34),(__m256i *)CONCAT44(uVar33,uVar32),
                  (__m256i *)CONCAT44(uVar4,uVar6));
    }
  }
  for (local_f6c = 0; local_f6c < 4; local_f6c = local_f6c + 1) {
    in0_13[0]._4_4_ = do_cols_00;
    in0_13[0]._0_4_ = bd_00;
    in0_13[1]._0_4_ = uVar44;
    in0_13[1]._4_4_ = uVar45;
    in0_13[2]._0_4_ = uVar46;
    in0_13[2]._4_4_ = uVar47;
    in0_13[3]._0_4_ = uVar48;
    in0_13[3]._4_4_ = uVar49;
    in1_13[0]._4_4_ = uVar38;
    in1_13[0]._0_4_ = uVar37;
    in1_13[1]._0_4_ = uVar39;
    in1_13[1]._4_4_ = uVar40;
    in1_13[2]._0_4_ = uVar41;
    in1_13[2]._4_4_ = uVar42;
    in1_13[3]._0_4_ = uVar43;
    in1_13[3]._4_4_ = out_shift_00;
    addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar36,uVar35),(__m256i *)CONCAT44(bit_00,uVar34),
                (__m256i *)CONCAT44(uVar33,uVar32),(__m256i *)CONCAT44(uVar4,uVar6));
  }
  cospim48_00 = (__m256i *)&local_fe0;
  idct64_stage8_avx2((__m256i *)CONCAT44(uVar5,uVar60),(__m256i *)CONCAT44(uVar59,uVar58),
                     (__m256i *)CONCAT44(uVar57,uVar56),(__m256i *)CONCAT44(uVar55,uVar54),
                     (__m256i *)CONCAT44(uVar53,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                     cospim48_00,(__m256i *)&local_1000,(__m256i *)local_fa0,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffdfc4,local_f5c),
                     in_stack_ffffffffffffdfc8);
  idct64_stage9_avx2((__m256i *)CONCAT44(uVar5,uVar60),(__m256i *)CONCAT44(uVar59,uVar58),
                     (__m256i *)CONCAT44(uVar57,uVar56),(__m256i *)CONCAT44(uVar55,uVar54),
                     (__m256i *)CONCAT44(uVar53,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                     (int)cospim48_00);
  idct64_stage10_avx2((__m256i *)CONCAT44(uVar5,uVar60),(__m256i *)CONCAT44(uVar59,uVar58),
                      (__m256i *)CONCAT44(uVar57,uVar56),(__m256i *)CONCAT44(uVar55,uVar54),
                      (__m256i *)CONCAT44(uVar53,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                      (int)cospim48_00);
  idct64_stage11_avx2((__m256i *)CONCAT44(uVar47,uVar46),(__m256i *)CONCAT44(uVar45,uVar44),
                      do_cols_00,bd_00,out_shift_00,(__m256i *)CONCAT44(uVar42,uVar41),cospim48_00);
  return;
}

Assistant:

static void idct64_low16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}